

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O3

void __thiscall
Assimp::FBX::FBXConverter::ConvertTransformOrder_TRStoSRT
          (FBXConverter *this,aiQuatKey *out_quat,aiVectorKey *out_scale,
          aiVectorKey *out_translation,KeyFrameListList *scaling,KeyFrameListList *translation,
          KeyFrameListList *rotation,KeyTimeList *times,double *maxTime,double *minTime,
          RotOrder order,aiVector3D *def_scale,aiVector3D *def_translate,aiVector3D *def_rotation)

{
  float fVar1;
  aiVector3D *paVar2;
  pointer plVar3;
  ulong uVar4;
  float *pfVar5;
  pointer plVar6;
  long lVar7;
  FBXConverter *this_00;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  aiQuaternion aVar31;
  aiMatrix4x4t<float> local_70;
  
  if ((rotation->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (rotation->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    plVar3 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish != plVar3) {
      pfVar5 = &(out_quat->mValue).y;
      uVar4 = 0;
      this_00 = (FBXConverter *)minTime;
      do {
        *(double *)(pfVar5 + -4) = ((double)plVar3[uVar4] / 46186158000.0) * this->anim_fps;
        aVar31 = EulerToQuaternion(this_00,def_rotation,order);
        *(aiQuaternion *)(pfVar5 + -2) = aVar31;
        uVar4 = uVar4 + 1;
        plVar3 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        pfVar5 = pfVar5 + 6;
      } while (uVar4 < (ulong)((long)(times->super__Vector_base<long,_std::allocator<long>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)plVar3 >> 3))
      ;
    }
  }
  else {
    InterpolateKeys(this,out_quat,times,rotation,def_rotation,maxTime,minTime,order);
  }
  if ((scaling->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (scaling->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    plVar3 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish != plVar3) {
      paVar2 = &out_scale->mValue;
      uVar4 = 0;
      do {
        *(double *)((long)(paVar2 + -1) + 4) =
             ((double)plVar3[uVar4] / 46186158000.0) * this->anim_fps;
        paVar2->z = def_scale->z;
        fVar25 = def_scale->y;
        paVar2->x = def_scale->x;
        paVar2->y = fVar25;
        uVar4 = uVar4 + 1;
        plVar3 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        paVar2 = paVar2 + 2;
      } while (uVar4 < (ulong)((long)(times->super__Vector_base<long,_std::allocator<long>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)plVar3 >> 3))
      ;
    }
  }
  else {
    InterpolateKeys(this,out_scale,times,scaling,def_scale,maxTime,minTime);
  }
  if ((translation->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (translation->
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    plVar3 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish == plVar3) {
      return;
    }
    paVar2 = &out_translation->mValue;
    uVar4 = 0;
    do {
      *(double *)((long)(paVar2 + -1) + 4) =
           ((double)plVar3[uVar4] / 46186158000.0) * this->anim_fps;
      paVar2->z = def_translate->z;
      fVar25 = def_translate->y;
      paVar2->x = def_translate->x;
      paVar2->y = fVar25;
      uVar4 = uVar4 + 1;
      plVar3 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_start;
      plVar6 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      paVar2 = paVar2 + 2;
    } while (uVar4 < (ulong)((long)plVar6 - (long)plVar3 >> 3));
  }
  else {
    InterpolateKeys(this,out_translation,times,translation,def_translate,maxTime,minTime);
    plVar3 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    plVar6 = (times->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if ((long)plVar6 - (long)plVar3 != 0) {
    lVar7 = (long)plVar6 - (long)plVar3 >> 3;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar8 = 0;
    do {
      fVar25 = *(float *)((long)&(out_translation->mValue).x + lVar8);
      fVar28 = *(float *)((long)&(out_quat->mValue).y + lVar8);
      fVar14 = *(float *)((long)&(out_quat->mValue).z + lVar8);
      fVar1 = *(float *)((long)&(out_quat->mValue).x + lVar8);
      fVar9 = fVar28 * fVar28 + fVar14 * fVar14;
      fVar30 = 1.0 - (fVar9 + fVar9);
      fVar9 = *(float *)((long)&(out_quat->mValue).w + lVar8);
      fVar18 = fVar1 * fVar14 + fVar28 * fVar9;
      fVar18 = fVar18 + fVar18;
      fVar11 = fVar1 * fVar28 + fVar14 * fVar9;
      fVar11 = fVar11 + fVar11;
      fVar19 = fVar28 * fVar14 - fVar9 * fVar1;
      fVar19 = fVar19 + fVar19;
      fVar29 = fVar1 * fVar14 - fVar28 * fVar9;
      fVar29 = fVar29 + fVar29;
      fVar10 = fVar9 * fVar1 + fVar28 * fVar14;
      fVar10 = fVar10 + fVar10;
      fVar27 = fVar11 * 0.0;
      fVar23 = fVar29 * 0.0;
      fVar24 = fVar25 * 0.0;
      fVar16 = fVar30 + fVar27 + fVar23 + fVar24;
      fVar22 = (fVar14 * fVar14 + fVar1 * fVar1) * -2.0 + 1.0;
      fVar12 = fVar22 * 0.0;
      fVar14 = (-fVar14 * fVar9 + fVar28 * fVar1) * 2.0;
      fVar30 = fVar30 * 0.0;
      fVar27 = fVar30 + fVar27;
      fVar20 = fVar19 * 0.0;
      fVar9 = fVar14 * 0.0;
      fVar17 = fVar9 + fVar12;
      fVar13 = fVar10 * 0.0;
      fVar26 = fVar12 + fVar14 + fVar13 + fVar24;
      fVar14 = (fVar1 * fVar1 + fVar28 * fVar28) * -2.0 + 1.0;
      fVar15 = fVar20 + fVar18 * 0.0;
      fVar21 = fVar14 * 0.0;
      fVar24 = fVar18 + fVar20 + fVar21 + fVar24;
      fVar28 = *(float *)((long)&(out_translation->mValue).y + lVar8);
      fVar20 = fVar28 * 0.0;
      fVar11 = fVar11 + fVar30 + fVar23 + fVar20;
      fVar22 = fVar22 + fVar9 + fVar13 + fVar20;
      fVar20 = fVar18 * 0.0 + fVar19 + fVar21 + fVar20;
      local_70.c4 = *(float *)((long)&(out_translation->mValue).z + lVar8);
      fVar18 = local_70.c4 * 0.0;
      fVar30 = fVar29 + fVar27 + fVar18;
      fVar10 = fVar10 + fVar17 + fVar18;
      fVar18 = fVar14 + fVar15 + fVar18;
      fVar9 = *(float *)((long)&(out_scale->mValue).y + lVar8);
      fVar19 = fVar26 * 0.0;
      fVar14 = *(float *)((long)&(out_scale->mValue).x + lVar8);
      fVar12 = fVar16 * 0.0 + fVar19;
      fVar1 = *(float *)((long)&(out_scale->mValue).z + lVar8);
      fVar29 = fVar24 * 0.0;
      fVar25 = fVar25 + 0.0;
      local_70.a4 = fVar12 + fVar29 + fVar25;
      fVar25 = fVar25 * 0.0;
      local_70.a3 = fVar1 * fVar24 + fVar12 + fVar25;
      local_70.a2 = fVar25 + fVar29 + fVar16 * 0.0 + fVar26 * fVar9;
      local_70.a1 = fVar25 + fVar29 + fVar16 * fVar14 + fVar19;
      fVar16 = fVar22 * 0.0;
      fVar25 = fVar11 * 0.0 + fVar16;
      fVar12 = fVar20 * 0.0;
      fVar28 = fVar28 + 0.0;
      local_70.b4 = fVar25 + fVar12 + fVar28;
      fVar28 = fVar28 * 0.0;
      local_70.b3 = fVar1 * fVar20 + fVar25 + fVar28;
      local_70.b2 = fVar28 + fVar12 + fVar11 * 0.0 + fVar22 * fVar9;
      local_70.b1 = fVar28 + fVar12 + fVar11 * fVar14 + fVar16;
      fVar13 = fVar17 + fVar13 + 0.0;
      fVar16 = fVar13 * 0.0;
      fVar25 = fVar10 * 0.0;
      fVar12 = fVar27 + fVar23 + 0.0;
      local_70.c4 = local_70.c4 + 0.0;
      fVar17 = local_70.c4 * 0.0;
      fVar28 = fVar25 + fVar30 * 0.0;
      fVar11 = fVar16 + fVar12 * 0.0;
      local_70.c3 = fVar1 * fVar18 + fVar28 + fVar17;
      local_70.c2 = fVar17 + fVar18 * 0.0 + fVar30 * 0.0 + fVar10 * fVar9;
      local_70.c1 = fVar17 + fVar18 * 0.0 + fVar30 * fVar14 + fVar25;
      fVar25 = fVar15 + fVar21 + 0.0;
      local_70.c4 = local_70.c4 + fVar18 * 0.0 + fVar28;
      local_70.d1 = fVar25 * 0.0 + fVar16 + fVar12 * fVar14 + 0.0;
      local_70.d2 = fVar25 * 0.0 + fVar13 * fVar9 + fVar12 * 0.0 + 0.0;
      local_70.d3 = fVar25 * fVar1 + fVar11 + 0.0;
      local_70.d4 = fVar25 * 0.0 + fVar11 + 1.0;
      aiMatrix4x4t<float>::Decompose
                (&local_70,(aiVector3t<float> *)((long)&(out_scale->mValue).x + lVar8),
                 (aiQuaterniont<float> *)((long)&(out_quat->mValue).w + lVar8),
                 (aiVector3t<float> *)((long)&(out_translation->mValue).x + lVar8));
      lVar8 = lVar8 + 0x18;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  return;
}

Assistant:

void FBXConverter::ConvertTransformOrder_TRStoSRT(aiQuatKey* out_quat, aiVectorKey* out_scale,
            aiVectorKey* out_translation,
            const KeyFrameListList& scaling,
            const KeyFrameListList& translation,
            const KeyFrameListList& rotation,
            const KeyTimeList& times,
            double& maxTime,
            double& minTime,
            Model::RotOrder order,
            const aiVector3D& def_scale,
            const aiVector3D& def_translate,
            const aiVector3D& def_rotation)
        {
            if (rotation.size()) {
                InterpolateKeys(out_quat, times, rotation, def_rotation, maxTime, minTime, order);
            }
            else {
                for (size_t i = 0; i < times.size(); ++i) {
                    out_quat[i].mTime = CONVERT_FBX_TIME(times[i]) * anim_fps;
                    out_quat[i].mValue = EulerToQuaternion(def_rotation, order);
                }
            }

            if (scaling.size()) {
                InterpolateKeys(out_scale, times, scaling, def_scale, maxTime, minTime);
            }
            else {
                for (size_t i = 0; i < times.size(); ++i) {
                    out_scale[i].mTime = CONVERT_FBX_TIME(times[i]) * anim_fps;
                    out_scale[i].mValue = def_scale;
                }
            }

            if (translation.size()) {
                InterpolateKeys(out_translation, times, translation, def_translate, maxTime, minTime);
            }
            else {
                for (size_t i = 0; i < times.size(); ++i) {
                    out_translation[i].mTime = CONVERT_FBX_TIME(times[i]) * anim_fps;
                    out_translation[i].mValue = def_translate;
                }
            }

            const size_t count = times.size();
            for (size_t i = 0; i < count; ++i) {
                aiQuaternion& r = out_quat[i].mValue;
                aiVector3D& s = out_scale[i].mValue;
                aiVector3D& t = out_translation[i].mValue;

                aiMatrix4x4 mat, temp;
                aiMatrix4x4::Translation(t, mat);
                mat *= aiMatrix4x4(r.GetMatrix());
                mat *= aiMatrix4x4::Scaling(s, temp);

                mat.Decompose(s, r, t);
            }
        }